

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_fd.c
# Opt level: O0

int archive_read_open_fd(archive *a,int fd,size_t block_size)

{
  int iVar1;
  uint *puVar2;
  archive *_a;
  archive *_a_00;
  archive_vtable_conflict *in_RDX;
  uint in_ESI;
  archive *in_RDI;
  void *b;
  read_fd_data *mine;
  stat st;
  void *in_stack_ffffffffffffff38;
  archive *in_stack_ffffffffffffff50;
  archive *in_stack_ffffffffffffff58;
  uint local_98;
  int local_4;
  
  archive_clear_error(in_RDI);
  iVar1 = fstat(in_ESI,(stat *)&stack0xffffffffffffff50);
  if (iVar1 == 0) {
    _a = (archive *)calloc(1,0x20);
    _a_00 = (archive *)malloc((size_t)in_RDX);
    if ((_a == (archive *)0x0) || (_a_00 == (archive *)0x0)) {
      archive_set_error(in_RDI,0xc,"No memory");
      free(_a);
      free(_a_00);
      local_4 = -0x1e;
    }
    else {
      _a->vtable = in_RDX;
      _a->archive_format_name = (char *)_a_00;
      _a->magic = in_ESI;
      if ((local_98 & 0xf000) == 0x8000) {
        archive_read_extract_set_skip_file(in_stack_ffffffffffffff50,(int64_t)_a,(int64_t)_a_00);
        *(undefined1 *)&_a->archive_format = 1;
      }
      archive_read_set_read_callback(_a,(archive_read_callback *)_a_00);
      archive_read_set_skip_callback(_a,(archive_skip_callback *)_a_00);
      archive_read_set_close_callback(_a,(undefined1 *)_a_00);
      archive_read_set_callback_data(_a_00,in_stack_ffffffffffffff38);
      local_4 = archive_read_open1(in_stack_ffffffffffffff58);
    }
  }
  else {
    puVar2 = (uint *)__errno_location();
    archive_set_error(in_RDI,(int)(ulong)*puVar2,"Can\'t stat fd %d",(ulong)in_ESI);
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

int
archive_read_open_fd(struct archive *a, int fd, size_t block_size)
{
	struct stat st;
	struct read_fd_data *mine;
	void *b;

	archive_clear_error(a);
	if (fstat(fd, &st) != 0) {
		archive_set_error(a, errno, "Can't stat fd %d", fd);
		return (ARCHIVE_FATAL);
	}

	mine = (struct read_fd_data *)calloc(1, sizeof(*mine));
	b = malloc(block_size);
	if (mine == NULL || b == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		free(mine);
		free(b);
		return (ARCHIVE_FATAL);
	}
	mine->block_size = block_size;
	mine->buffer = b;
	mine->fd = fd;
	/*
	 * Skip support is a performance optimization for anything
	 * that supports lseek().  On FreeBSD, only regular files and
	 * raw disk devices support lseek() and there's no portable
	 * way to determine if a device is a raw disk device, so we
	 * only enable this optimization for regular files.
	 */
	if (S_ISREG(st.st_mode)) {
		archive_read_extract_set_skip_file(a, st.st_dev, st.st_ino);
		mine->use_lseek = 1;
	}
#if defined(__CYGWIN__) || defined(_WIN32)
	setmode(mine->fd, O_BINARY);
#endif

	archive_read_set_read_callback(a, file_read);
	archive_read_set_skip_callback(a, file_skip);
	archive_read_set_close_callback(a, file_close);
	archive_read_set_callback_data(a, mine);
	return (archive_read_open1(a));
}